

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::AddLine(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImU32 col,float thickness)

{
  float fVar1;
  float fVar2;
  ImVec2 *pIVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 *pIVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  if (0xffffff < col) {
    fVar1 = a->x;
    fVar2 = a->y;
    iVar8 = (this->_Path).Size;
    iVar9 = (this->_Path).Capacity;
    if (iVar8 == iVar9) {
      iVar8 = iVar8 + 1;
      if (iVar9 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar9 / 2 + iVar9;
      }
      if (iVar8 < iVar7) {
        iVar8 = iVar7;
      }
      if (iVar9 < iVar8) {
        pIVar6 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar6,pIVar3,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar6;
        (this->_Path).Capacity = iVar8;
      }
    }
    IVar5.y = fVar2 + 0.5;
    IVar5.x = fVar1 + 0.5;
    (this->_Path).Data[(this->_Path).Size] = IVar5;
    iVar9 = (this->_Path).Size;
    iVar7 = (this->_Path).Capacity;
    iVar8 = iVar9 + 1;
    (this->_Path).Size = iVar8;
    fVar1 = b->x;
    fVar2 = b->y;
    if (iVar8 == iVar7) {
      iVar9 = iVar9 + 2;
      if (iVar7 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar7 / 2 + iVar7;
      }
      if (iVar9 < iVar8) {
        iVar9 = iVar8;
      }
      if (iVar7 < iVar9) {
        pIVar6 = (ImVec2 *)ImGui::MemAlloc((long)iVar9 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar6,pIVar3,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar6;
        (this->_Path).Capacity = iVar9;
      }
    }
    IVar4.y = fVar2 + 0.5;
    IVar4.x = fVar1 + 0.5;
    (this->_Path).Data[(this->_Path).Size] = IVar4;
    iVar8 = (this->_Path).Size + 1;
    (this->_Path).Size = iVar8;
    AddPolyline(this,(this->_Path).Data,iVar8,col,false,thickness);
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddLine(const ImVec2& a, const ImVec2& b, ImU32 col, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    PathLineTo(a + ImVec2(0.5f,0.5f));
    PathLineTo(b + ImVec2(0.5f,0.5f));
    PathStroke(col, false, thickness);
}